

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

void test_write_one_buffer_one_chunk_read_in_callbacks_then_close(void)

{
  size_t sVar1;
  int iVar2;
  cio_error cVar3;
  memory_stream *ms;
  uint8_t *__ptr;
  void *__dest;
  UNITY_INT UStack_90;
  cio_read_buffer rb;
  cio_write_buffer local_68;
  cio_write_buffer wb;
  
  ms = (memory_stream *)malloc(0x100);
  local_68.next = &wb;
  wb.data.head.q_len = (size_t)anon_var_dwarf_d3b;
  wb.data.element.length = 5;
  wb.next = &local_68;
  local_68.data.head.q_len = 1;
  local_68.data.element.length = 5;
  write_some_fake.custom_fake = write_some_all;
  local_68.prev = local_68.next;
  wb.prev = wb.next;
  iVar2 = memory_stream_init(ms,"HelloWorld");
  UnityAssertEqualNumber
            (0,(long)iVar2,"Could not allocate memory for test!",0x56d,UNITY_DISPLAY_STYLE_INT);
  read_some_fake.custom_fake = read_some_max;
  dummy_read_handler_fake.custom_fake = save_to_check_buffer_and_read_again;
  second_dummy_read_handler_fake.custom_fake = save_to_second_check_buffer_and_close;
  __ptr = (uint8_t *)malloc(5);
  if (__ptr == (uint8_t *)0x0) {
    UStack_90 = -0x16;
  }
  else {
    rb.end = __ptr + 5;
    UStack_90 = 0;
    rb.data = __ptr;
    rb.add_ptr = __ptr;
    rb.fetch_ptr = __ptr;
  }
  UnityAssertEqualNumber
            (0,UStack_90,"Read buffer was not initialized correctly!",0x576,UNITY_DISPLAY_STYLE_INT)
  ;
  dummy_write_handler_fake.custom_fake = write_then_read;
  cVar3 = cio_buffered_stream_init((cio_buffered_stream *)(ms + 1),(cio_io_stream *)ms);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Buffer was not initialized correctly!",0x57b,UNITY_DISPLAY_STYLE_INT);
  cVar3 = cio_buffered_stream_write
                    ((cio_buffered_stream *)(ms + 1),&local_68,dummy_write_handler,&rb);
  UnityAssertEqualNumber(0,(long)cVar3,"Return value not correct!",0x57d,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x57f,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)dummy_write_handler_fake.call_count,"Handler was not called!",0x580,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_write_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x581,UNITY_DISPLAY_STYLE_INT);
  iVar2 = bcmp(write_check_buffer,"Hello",5);
  if (iVar2 != 0) {
    UnityFail("Data was not written correctly!",0x582);
  }
  UnityAssertEqualNumber
            (1,(ulong)dummy_read_handler_fake.call_count,"Handler was not called!",0x584,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)dummy_read_handler_fake.arg2_val,"Handler was not called with CIO_SUCCESS!",
             0x585,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)dummy_read_handler_fake.arg3_val,
             "Handler was not called with original read buffer!",0x586,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)second_dummy_read_handler_fake.call_count,"Second handler was not called!",
             0x588,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(long)second_dummy_read_handler_fake.arg2_val,
             "Second handler was not called with CIO_SUCCESS!",0x589,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)&rb,(UNITY_INT)second_dummy_read_handler_fake.arg3_val,
             "Second handler was not called with original read buffer!",0x58a,
             UNITY_DISPLAY_STYLE_INT);
  __dest = malloc(0xb);
  sVar1 = first_check_buffer_pos;
  if (__dest == (void *)0x0) {
    UnityFail("Could not allocate memory for chunks!",0x58e);
  }
  memcpy(__dest,first_check_buffer,first_check_buffer_pos);
  memcpy((void *)((long)__dest + sVar1),second_check_buffer,second_check_buffer_pos);
  iVar2 = bcmp(__dest,"HelloWorld",10);
  if (iVar2 == 0) {
    free(__dest);
    UnityAssertEqualNumber(0,(long)cVar3,"Return value not correct!",0x595,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)close_fake.call_count,"Underlying cio_iostream was not closed!",0x596,
               UNITY_DISPLAY_STYLE_INT);
    free(__ptr);
    return;
  }
  UnityFail("Handler was not called with correct data!",0x592);
}

Assistant:

static void test_write_one_buffer_one_chunk_read_in_callbacks_then_close(void)
{
	static const char *test_data = "Hello";
	struct client *client = malloc(sizeof(*client));

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	struct cio_write_buffer wb;
	cio_write_buffer_const_element_init(&wb, test_data, strlen(test_data));
	cio_write_buffer_queue_tail(&wbh, &wb);

	write_some_fake.custom_fake = write_some_all;

	static const char *read_test_data = CHUNK1 CHUNK2;
	TEST_ASSERT_EQUAL_INT_MESSAGE(0, memory_stream_init(&client->ms, read_test_data), "Could not allocate memory for test!");
	read_some_fake.custom_fake = read_some_max;
	dummy_read_handler_fake.custom_fake = save_to_check_buffer_and_read_again;
	second_dummy_read_handler_fake.custom_fake = save_to_second_check_buffer_and_close;

	size_t read_buffer_size = MAX(strlen(CHUNK1), strlen(CHUNK2));
	uint8_t *buffer = malloc(read_buffer_size);
	struct cio_read_buffer rb;
	enum cio_error err = cio_read_buffer_init(&rb, buffer, read_buffer_size);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Read buffer was not initialized correctly!");

	dummy_write_handler_fake.custom_fake = write_then_read;

	err = cio_buffered_stream_init(&client->bs, &client->ms.ios);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Buffer was not initialized correctly!");
	err = cio_buffered_stream_write(&client->bs, &wbh, dummy_write_handler, &rb);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");

	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_write_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_write_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_MESSAGE(memcmp((const char *)write_check_buffer, test_data, strlen(test_data)) == 0, "Data was not written correctly!");

	TEST_ASSERT_EQUAL_MESSAGE(1, dummy_read_handler_fake.call_count, "Handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, dummy_read_handler_fake.arg2_val, "Handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, dummy_read_handler_fake.arg3_val, "Handler was not called with original read buffer!");

	TEST_ASSERT_EQUAL_MESSAGE(1, second_dummy_read_handler_fake.call_count, "Second handler was not called!");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, second_dummy_read_handler_fake.arg2_val, "Second handler was not called with CIO_SUCCESS!");
	TEST_ASSERT_EQUAL_MESSAGE(&rb, second_dummy_read_handler_fake.arg3_val, "Second handler was not called with original read buffer!");

	char *result = malloc(strlen(CHUNK1) + strlen(CHUNK2) + 1);
	if (result == NULL) {
		TEST_FAIL_MESSAGE("Could not allocate memory for chunks!");
	}
	memcpy(result, first_check_buffer, first_check_buffer_pos);
	memcpy(&result[first_check_buffer_pos], second_check_buffer, second_check_buffer_pos);
	TEST_ASSERT_MESSAGE(memcmp(result, CHUNK1 CHUNK2, strlen(CHUNK1 CHUNK2)) == 0, "Handler was not called with correct data!");
	free(result);

	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Return value not correct!");
	TEST_ASSERT_EQUAL_MESSAGE(1, close_fake.call_count, "Underlying cio_iostream was not closed!");
	free(buffer);
}